

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

float vkt::shaderexecutor::anon_unknown_0::makeFloatRepresentable(float f,Precision precision)

{
  int iVar1;
  Float32 FVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  float fVar7;
  Float32 float32Representation;
  
  fVar7 = f;
  if (precision != PRECISION_HIGHP) {
    uVar5 = (ulong)precision;
    iVar4 = *(int *)(&DAT_009cf088 + uVar5 * 4);
    uVar6 = ~(-1 << ((&DAT_009ceaec)[uVar5 * 4] & 0x1f)) <<
            (0x17 - (&DAT_009ceaec)[uVar5 * 4] & 0x1f);
    if (precision == PRECISION_LOWP) {
      fVar7 = (float)(iVar4 * 0x800000 + 0x3f800001);
    }
    else {
      fVar7 = 0.0;
    }
    iVar1 = *(int *)(&DAT_009cf07c + uVar5 * 4);
    float32Representation.m_value = (StorageType)f;
    iVar3 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&float32Representation);
    if (iVar4 <= iVar3) {
      iVar4 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&float32Representation);
      FVar2 = float32Representation;
      if (iVar1 < iVar4) {
        fVar7 = (float)(iVar1 * 0x800000 + 0x3f800000U | uVar6);
        if ((int)float32Representation.m_value < 0) {
          fVar7 = (float)((uint)fVar7 ^ (uint)DAT_0094e180);
        }
      }
      else {
        iVar4 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&float32Representation);
        fVar7 = (float)(iVar4 * 0x800000 + 0x3f800000U | FVar2.m_value & 0x80000000 |
                       uVar6 & float32Representation.m_value & 0x7fffff);
      }
    }
  }
  return fVar7;
}

Assistant:

static float makeFloatRepresentable (float f, glu::Precision precision)
{
	if (precision == glu::PRECISION_HIGHP)
	{
		// \note: assuming f is not extended-precision
		return f;
	}
	else
	{
		const int			numMantissaBits				= getMinMantissaBits(precision);
		const int			maxNormalizedValueExponent	= getMaxNormalizedValueExponent(precision);
		const int			minNormalizedValueExponent	= getMinNormalizedValueExponent(precision);
		const deUint32		representableMantissaMask	= ((deUint32(1) << numMantissaBits) - 1) << (23 - (deUint32)numMantissaBits);
		const float			largestRepresentableValue	= tcu::Float32::constructBits(+1, maxNormalizedValueExponent, ((1u << numMantissaBits) - 1u) << (23u - (deUint32)numMantissaBits)).asFloat();
		const bool			zeroNotRepresentable		= (precision == glu::PRECISION_LOWP);

		// if zero is not required to be representable, use smallest positive non-subnormal value
		const float			zeroValue					= (zeroNotRepresentable) ? (tcu::Float32::constructBits(+1, minNormalizedValueExponent, 1).asFloat()) : (0.0f);

		const tcu::Float32	float32Representation		(f);

		if (float32Representation.exponent() < minNormalizedValueExponent)
		{
			// flush too small values to zero
			return zeroValue;
		}
		else if (float32Representation.exponent() > maxNormalizedValueExponent)
		{
			// clamp too large values
			return (float32Representation.sign() == +1) ? (largestRepresentableValue) : (-largestRepresentableValue);
		}
		else
		{
			// remove unrepresentable mantissa bits
			const tcu::Float32 targetRepresentation(tcu::Float32::constructBits(float32Representation.sign(),
													float32Representation.exponent(),
													float32Representation.mantissaBits() & representableMantissaMask));

			return targetRepresentation.asFloat();
		}
	}
}